

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

CNode * __thiscall
CConnman::ConnectNode
          (CConnman *this,CAddress addrConnect,char *pszDest,bool fCountFailure,
          ConnectionType conn_type,bool use_v2transport)

{
  vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_> *__x;
  Mutex *pMVar1;
  queue<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>,_std::deque<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>,_std::allocator<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>_>_>_>
  *this_00;
  CThreadInterrupt *interrupt;
  atomic<long> *paVar2;
  uint64_t data;
  Session *this_01;
  _Elt_pointer puVar3;
  _Map_pointer ppuVar4;
  AddrMan *this_02;
  double dVar5;
  DNSLookupFn dns_lookup_function;
  unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_> uVar6;
  unique_ptr<Sock,_std::default_delete<Sock>_> uVar7;
  pointer pCVar8;
  mutex_type *pmVar9;
  undefined8 __last;
  unique_ptr<Sock,_std::default_delete<Sock>_> uVar10;
  bool bVar11;
  uint16_t portDefault;
  uint16_t uVar12;
  Network net;
  Logger *pLVar13;
  size_t sVar14;
  time_point tVar15;
  RecursiveMutex *pRVar16;
  CNode *pCVar17;
  __uniq_ptr_data<i2p::sam::Session,_std::default_delete<i2p::sam::Session>,_true,_true> _Var18;
  CSipHasher *pCVar19;
  uint64_t nKeyedNetGroupIn;
  CAddress *addrIn;
  undefined7 in_register_00000011;
  int iVar20;
  undefined7 in_register_00000081;
  undefined1 in_R9B;
  __shared_count<(__gnu_cxx::_Lock_policy)2> address;
  pointer __p;
  undefined8 uVar21;
  char (*args) [3];
  char *pcVar22;
  CConnman *this_03;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view in;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  shared_ptr<Sock> sock_00;
  string_view source_file_03;
  CNodeOptions *node_opts;
  undefined1 in_stack_fffffffffffffd08 [14];
  _Manager_type in_stack_fffffffffffffd18;
  CConnman *pCVar23;
  bool local_2bc;
  undefined1 local_288 [16];
  uint16_t port;
  undefined6 uStack_276;
  pointer pNStack_270;
  pointer local_268;
  NetPermissionFlags permission_flags;
  unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_> i2p_transient_session;
  unique_ptr<Sock,_std::default_delete<Sock>_> sock;
  _Any_data local_248;
  code *local_238;
  vector<CAddress,_std::allocator<CAddress>_> local_228;
  allocator<char> local_209;
  char *pszDest_local;
  direct_or_indirect local_200;
  uint local_1f0;
  uint64_t local_1e8;
  uint16_t local_1e0;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock28;
  __native_type local_1c8;
  CAddress addr_bind;
  Proxy proxy;
  direct_or_indirect local_108;
  uint local_f8;
  size_type local_f0;
  undefined4 uStack_ec;
  undefined2 local_e8;
  Connection conn;
  string local_58;
  long local_38;
  
  pszDest_local = (char *)CONCAT71(in_register_00000011,fCountFailure);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar20 = (int)(string *)CONCAT71(in_register_00000081,use_v2transport);
  if (iVar20 == 0) {
    __assert_fail("conn_type != ConnectionType::INBOUND",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
                  ,0x187,
                  "CNode *CConnman::ConnectNode(CAddress, const char *, bool, ConnectionType, bool)"
                 );
  }
  if (pszDest_local == (char *)0x0) {
    bVar11 = IsLocal((CService *)pszDest);
    if (!bVar11) {
      prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&conn,
                 (prevector<16U,_unsigned_char,_unsigned_int,_int> *)pszDest);
      conn.me.super_CNetAddr.m_addr._16_8_ = *(undefined8 *)(pszDest + 0x18);
      conn.me.super_CNetAddr.m_net._0_1_ = (undefined1)*(undefined2 *)(pszDest + 0x20);
      conn.me.super_CNetAddr.m_net._1_1_ =
           (undefined1)((ushort)*(undefined2 *)(pszDest + 0x20) >> 8);
      pCVar17 = FindNode(this,(CService *)&conn);
      if (0x10 < conn.me.super_CNetAddr.m_addr._union.indirect_contents.capacity) {
        free((void *)conn.sock._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
                     super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
                     super__Head_base<0UL,_Sock_*,_false>._M_head_impl);
        conn.sock._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
        super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
        super__Head_base<0UL,_Sock_*,_false>._M_head_impl =
             (__uniq_ptr_data<Sock,_std::default_delete<Sock>,_true,_true>)
             (__uniq_ptr_impl<Sock,_std::default_delete<Sock>_>)0x0;
      }
      if (pCVar17 == (CNode *)0x0) goto LAB_0019e838;
      logging_function._M_str = "ConnectNode";
      logging_function._M_len = 0xb;
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
      ;
      source_file._M_len = 0x57;
      LogPrintFormatInternal<>
                (logging_function,source_file,0x191,ALL,Info,(ConstevalFormatString<0U>)0x7e59fc);
    }
    pCVar17 = (CNode *)0x0;
  }
  else {
LAB_0019e838:
    pLVar13 = LogInstance();
    bVar11 = BCLog::Logger::WillLogCategoryLevel(pLVar13,NET,Debug);
    pcVar22 = pszDest_local;
    this_03 = this;
    if (bVar11) {
      args = (char (*) [3])0x7deb03;
      if (in_R9B != NET_UNROUTABLE) {
        args = (char (*) [3])0x7dd10d;
      }
      if (pszDest_local == (char *)0x0) {
        CService::ToStringAddrPort_abi_cxx11_((string *)&conn,(CService *)pszDest);
      }
      else {
        conn.sock._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
        super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
        super__Head_base<0UL,_Sock_*,_false>._M_head_impl =
             (__uniq_ptr_data<Sock,_std::default_delete<Sock>,_true,_true>)
             ((long)&conn.me.super_CNetAddr.m_addr._union + 8);
        sVar14 = strlen(pszDest_local);
        std::__cxx11::string::_M_construct<char_const*>((string *)&conn,pcVar22,pcVar22 + sVar14);
      }
      dVar5 = 0.0;
      if (pszDest_local == (char *)0x0) {
        tVar15 = NodeClock::now();
        dVar5 = (double)((long)tVar15.__d.__r / 1000000000 - *(long *)(pszDest + 0x28));
      }
      proxy.proxy.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)(dVar5 / 3600.0)
      ;
      logging_function_00._M_str = "ConnectNode";
      logging_function_00._M_len = 0xb;
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
      ;
      source_file_00._M_len = 0x57;
      LogPrintFormatInternal<char[3],std::__cxx11::string,double>
                (logging_function_00,source_file_00,0x199,NET,Debug,
                 (ConstevalFormatString<3U>)0x7e5a2e,args,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&conn,
                 (double *)&proxy);
      this_03 = this;
      if (conn.sock._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
          super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
          super__Head_base<0UL,_Sock_*,_false>._M_head_impl !=
          (__uniq_ptr_data<Sock,_std::default_delete<Sock>,_true,_true>)
          ((long)&conn.me.super_CNetAddr.m_addr._union + 8)) {
        operator_delete((void *)conn.sock._M_t.
                                super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
                                super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
                                super__Head_base<0UL,_Sock_*,_false>._M_head_impl,
                        CONCAT44(conn.me.super_CNetAddr.m_addr._union._12_4_,
                                 conn.me.super_CNetAddr.m_addr._union.indirect_contents.capacity) +
                        1);
      }
    }
    if (pszDest_local == (char *)0x0) {
      portDefault = this->m_params->nDefaultPort;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,pszDest_local,&local_209);
      portDefault = GetDefaultPort(this,&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
    }
    local_228.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
    super__Vector_impl_data._M_start = (CAddress *)0x0;
    local_228.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
    super__Vector_impl_data._M_finish = (CAddress *)0x0;
    local_228.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (pszDest_local == (char *)0x0) {
      std::vector<CAddress,_std::allocator<CAddress>_>::push_back(&local_228,(value_type *)pszDest);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&conn,pszDest_local,(allocator<char> *)&addr_bind);
      if (fNameLookup == true) {
        bVar11 = HaveNameProxy();
        bVar11 = !bVar11;
      }
      else {
        bVar11 = false;
      }
      std::
      function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
      ::function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                  *)&local_248,&g_dns_lookup_abi_cxx11_);
      dns_lookup_function.super__Function_base._M_functor._14_2_ = portDefault;
      dns_lookup_function.super__Function_base._M_functor._0_14_ = in_stack_fffffffffffffd08;
      dns_lookup_function.super__Function_base._M_manager = in_stack_fffffffffffffd18;
      dns_lookup_function._M_invoker = (_Invoker_type)this_03;
      Lookup((vector<CService,_std::allocator<CService>_> *)&proxy,(string *)&conn,portDefault,
             bVar11,0x100,dns_lookup_function);
      if (local_238 != (code *)0x0) {
        (*local_238)(&local_248,&local_248,__destroy_functor);
      }
      if (conn.sock._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
          super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
          super__Head_base<0UL,_Sock_*,_false>._M_head_impl !=
          (__uniq_ptr_data<Sock,_std::default_delete<Sock>,_true,_true>)
          ((long)&conn.me.super_CNetAddr.m_addr._union + 8)) {
        operator_delete((void *)conn.sock._M_t.
                                super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
                                super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
                                super__Head_base<0UL,_Sock_*,_false>._M_head_impl,
                        CONCAT44(conn.me.super_CNetAddr.m_addr._union._12_4_,
                                 conn.me.super_CNetAddr.m_addr._union.indirect_contents.capacity) +
                        1);
      }
      __last = proxy.proxy.super_CNetAddr.m_addr._union._8_8_;
      uVar21 = proxy.proxy.super_CNetAddr.m_addr._union.indirect_contents.indirect;
      if (proxy.proxy.super_CNetAddr.m_addr._union.indirect_contents.indirect ==
          (char *)proxy.proxy.super_CNetAddr.m_addr._union._8_8_) {
        std::vector<CAddress,_std::allocator<CAddress>_>::push_back
                  (&local_228,(value_type *)pszDest);
      }
      else {
        FastRandomContext::FastRandomContext((FastRandomContext *)&conn,false);
        std::
        shuffle<__gnu_cxx::__normal_iterator<CService*,std::vector<CService,std::allocator<CService>>>,FastRandomContext>
                  ((__normal_iterator<CService_*,_std::vector<CService,_std::allocator<CService>_>_>
                   )uVar21,(__normal_iterator<CService_*,_std::vector<CService,_std::allocator<CService>_>_>
                            )__last,(FastRandomContext *)&conn);
        ChaCha20::~ChaCha20((ChaCha20 *)((long)&conn.me.super_CNetAddr.m_addr._union + 8));
        if (proxy.proxy.super_CNetAddr.m_addr._union.indirect_contents.indirect !=
            (char *)proxy.proxy.super_CNetAddr.m_addr._union._8_8_) {
          pcVar22 = pszDest + 0x28;
          pRVar16 = &this_03->m_nodes_mutex;
          uVar21 = proxy.proxy.super_CNetAddr.m_addr._union.indirect_contents.indirect;
          do {
            MaybeFlipIPv6toCJDNS((CService *)&local_108.indirect_contents,(CService *)uVar21);
            prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                      ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&conn,
                       (prevector<16U,_unsigned_char,_unsigned_int,_int> *)
                       &local_108.indirect_contents);
            conn.me.super_CNetAddr.m_addr._size = local_f0;
            conn.me.super_CNetAddr.m_addr._20_4_ = uStack_ec;
            conn.me.super_CNetAddr.m_net._0_1_ = (undefined1)local_e8;
            conn.me.super_CNetAddr.m_net._1_1_ = (undefined1)((ushort)local_e8 >> 8);
            conn.me.port = 0xe100;
            conn.me._34_6_ = 0x5f5;
            conn.peer.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
            if (0x10 < *(uint *)(pszDest + 0x10)) {
              free(*(void **)pszDest);
            }
            *(__uniq_ptr_data<Sock,_std::default_delete<Sock>,_true,_true> *)pszDest =
                 conn.sock._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
                 super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
                 super__Head_base<0UL,_Sock_*,_false>._M_head_impl;
            *(char **)(pszDest + 8) =
                 conn.me.super_CNetAddr.m_addr._union.indirect_contents.indirect;
            *(size_type *)(pszDest + 0x10) =
                 conn.me.super_CNetAddr.m_addr._union.indirect_contents.capacity;
            conn.me.super_CNetAddr.m_addr._union.indirect_contents.capacity = 0;
            *(undefined8 *)(pszDest + 0x18) = conn.me.super_CNetAddr.m_addr._16_8_;
            *(ushort *)(pszDest + 0x20) =
                 CONCAT11(conn.me.super_CNetAddr.m_net._1_1_,
                          (undefined1)conn.me.super_CNetAddr.m_net);
            *(undefined8 *)pcVar22 = conn.me._32_8_;
            *(char **)(pcVar22 + 8) =
                 conn.peer.super_CNetAddr.m_addr._union.indirect_contents.indirect;
            if (0x10 < local_f8) {
              free(local_108.indirect_contents.indirect);
              local_108.indirect_contents.indirect = (char *)0x0;
            }
            bVar11 = CNetAddr::IsValid((CNetAddr *)pszDest);
            if (!bVar11) {
              pLVar13 = LogInstance();
              bVar11 = BCLog::Logger::WillLogCategoryLevel(pLVar13,NET,Debug);
              if (bVar11) {
                CService::ToStringAddrPort_abi_cxx11_((string *)&conn,(CService *)pszDest);
                logging_function_03._M_str = "ConnectNode";
                logging_function_03._M_len = 0xb;
                source_file_03._M_str =
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
                ;
                source_file_03._M_len = 0x57;
                LogPrintFormatInternal<std::__cxx11::string,char_const*>
                          (logging_function_03,source_file_03,0x1aa,NET,Debug,
                           (ConstevalFormatString<2U>)0x7e5a58,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &conn,&pszDest_local);
                if (conn.sock._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
                    super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
                    super__Head_base<0UL,_Sock_*,_false>._M_head_impl !=
                    (__uniq_ptr_data<Sock,_std::default_delete<Sock>,_true,_true>)
                    ((long)&conn.me.super_CNetAddr.m_addr._union + 8)) {
                  operator_delete((void *)conn.sock._M_t.
                                          super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>.
                                          _M_t.
                                          super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>
                                          .super__Head_base<0UL,_Sock_*,_false>._M_head_impl,
                                  CONCAT44(conn.me.super_CNetAddr.m_addr._union._12_4_,
                                           conn.me.super_CNetAddr.m_addr._union.indirect_contents.
                                           capacity) + 1);
                }
              }
LAB_0019fa7e:
              std::vector<CService,_std::allocator<CService>_>::~vector
                        ((vector<CService,_std::allocator<CService>_> *)&proxy);
              pCVar17 = (CNode *)0x0;
              goto LAB_0019fa94;
            }
            addr_bind.super_CService.super_CNetAddr.m_addr._union._8_8_ =
                 addr_bind.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
            addr_bind.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
                 (char *)pRVar16;
            std::unique_lock<std::recursive_mutex>::lock
                      ((unique_lock<std::recursive_mutex> *)&addr_bind);
            prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                      ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&conn,
                       (prevector<16U,_unsigned_char,_unsigned_int,_int> *)pszDest);
            conn.me.super_CNetAddr.m_addr._16_8_ = *(undefined8 *)(pszDest + 0x18);
            conn.me.super_CNetAddr.m_net._0_1_ = (undefined1)*(undefined2 *)(pszDest + 0x20);
            conn.me.super_CNetAddr.m_net._1_1_ =
                 (undefined1)((ushort)*(undefined2 *)(pszDest + 0x20) >> 8);
            pCVar17 = FindNode(this_03,(CService *)&conn);
            if (0x10 < conn.me.super_CNetAddr.m_addr._union.indirect_contents.capacity) {
              free((void *)conn.sock._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>.
                           _M_t.super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
                           super__Head_base<0UL,_Sock_*,_false>._M_head_impl);
              conn.sock._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
              super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
              super__Head_base<0UL,_Sock_*,_false>._M_head_impl =
                   (__uniq_ptr_data<Sock,_std::default_delete<Sock>,_true,_true>)
                   (__uniq_ptr_impl<Sock,_std::default_delete<Sock>_>)0x0;
            }
            if (pCVar17 == (CNode *)0x0) {
              std::vector<CAddress,_std::allocator<CAddress>_>::push_back
                        (&local_228,(value_type *)pszDest);
            }
            else {
              CService::ToStringAddrPort_abi_cxx11_((string *)&conn,(CService *)pszDest);
              logging_function_01._M_str = "ConnectNode";
              logging_function_01._M_len = 0xb;
              source_file_01._M_str =
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
              ;
              source_file_01._M_len = 0x57;
              LogPrintFormatInternal<char_const*,std::__cxx11::string>
                        (logging_function_01,source_file_01,0x1b2,ALL,Info,
                         (ConstevalFormatString<2U>)0x7e5a85,&pszDest_local,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&conn)
              ;
              if (conn.sock._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
                  super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
                  super__Head_base<0UL,_Sock_*,_false>._M_head_impl !=
                  (__uniq_ptr_data<Sock,_std::default_delete<Sock>,_true,_true>)
                  ((long)&conn.me.super_CNetAddr.m_addr._union + 8)) {
                operator_delete((void *)conn.sock._M_t.
                                        super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t
                                        .super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
                                        super__Head_base<0UL,_Sock_*,_false>._M_head_impl,
                                CONCAT44(conn.me.super_CNetAddr.m_addr._union._12_4_,
                                         conn.me.super_CNetAddr.m_addr._union.indirect_contents.
                                         capacity) + 1);
              }
            }
            std::unique_lock<std::recursive_mutex>::~unique_lock
                      ((unique_lock<std::recursive_mutex> *)&addr_bind);
            if (pCVar17 != (CNode *)0x0) goto LAB_0019fa7e;
            uVar21 = uVar21 + 0x28;
          } while (uVar21 != proxy.proxy.super_CNetAddr.m_addr._union._8_8_);
        }
      }
      std::vector<CService,_std::allocator<CService>_>::~vector
                ((vector<CService,_std::allocator<CService>_> *)&proxy);
    }
    sock._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
    super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.super__Head_base<0UL,_Sock_*,_false>.
    _M_head_impl = (__uniq_ptr_data<Sock,_std::default_delete<Sock>,_true,_true>)
                   (__uniq_ptr_impl<Sock,_std::default_delete<Sock>_>)0x0;
    CService::CService(&proxy.proxy);
    proxy.m_unix_socket_path._M_dataplus._M_p = (pointer)&proxy.m_unix_socket_path.field_2;
    proxy.m_unix_socket_path._M_string_length = 0;
    proxy.m_unix_socket_path.field_2._M_local_buf[0] = '\0';
    proxy.m_is_unix_socket = false;
    proxy.m_randomize_credentials = false;
    CService::CService(&addr_bind.super_CService);
    addr_bind.nTime.__d.__r = (duration)100000000;
    addr_bind.nServices = NODE_NONE;
    pCVar23 = this_03;
    bVar11 = CNetAddr::IsValid((CNetAddr *)&addr_bind);
    pCVar8 = local_228.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (bVar11) {
      __assert_fail("!addr_bind.IsValid()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
                    ,0x1c5,
                    "CNode *CConnman::ConnectNode(CAddress, const char *, bool, ConnectionType, bool)"
                   );
    }
    i2p_transient_session._M_t.
    super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>._M_t.
    super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>.
    super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl =
         (__uniq_ptr_data<i2p::sam::Session,_std::default_delete<i2p::sam::Session>,_true,_true>)
         (__uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>)0x0;
    if (local_228.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_228.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pMVar1 = &this_03->m_unused_i2p_sessions_mutex;
      this_00 = &this_03->m_unused_i2p_sessions;
      interrupt = &this_03->interruptNet;
      __x = &this_03->vWhitelistedRangeOutgoing;
      pCVar17 = (CNode *)0x0;
      address._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_228.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
           super__Vector_impl_data._M_start;
      do {
        bVar11 = CNetAddr::IsValid((CNetAddr *)address._M_pi);
        if (bVar11) {
          net = CNetAddr::GetNetwork((CNetAddr *)address._M_pi);
          bVar11 = GetProxy(net,&proxy);
          permission_flags = permission_flags & 0xffffff00;
          if (bVar11 && address._M_pi[1]._M_use_count == 4) {
            conn.sock._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
            super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
            super__Head_base<0UL,_Sock_*,_false>._M_head_impl =
                 (__uniq_ptr_data<Sock,_std::default_delete<Sock>,_true,_true>)
                 (__uniq_ptr_impl<Sock,_std::default_delete<Sock>_>)0x0;
            CService::CService(&conn.me);
            CService::CService(&conn.peer);
            this_01 = (this_03->m_i2p_sam_session)._M_t.
                      super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>
                      .super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl;
            if (this_01 == (Session *)0x0) {
              criticalblock28.super_unique_lock._8_8_ =
                   criticalblock28.super_unique_lock._8_8_ & 0xffffffffffffff00;
              criticalblock28.super_unique_lock._M_device = &pMVar1->super_mutex;
              std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&criticalblock28);
              puVar3 = (this_03->m_unused_i2p_sessions).c.
                       super__Deque_base<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>,_std::allocator<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>_>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_cur;
              if ((this_03->m_unused_i2p_sessions).c.
                  super__Deque_base<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>,_std::allocator<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur == puVar3) {
                _Var18.
                super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>.
                _M_t.
                super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>
                .super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl =
                     (__uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>)
                     operator_new(0x118);
                i2p::sam::Session::Session
                          ((Session *)
                           _Var18.
                           super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>
                           .super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl,&proxy,
                           interrupt);
                uVar6 = i2p_transient_session;
                _port = (Session *)0x0;
                bVar11 = (__uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>
                          )i2p_transient_session._M_t.
                           super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>
                           .super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl !=
                         (__uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>
                          )0x0;
                i2p_transient_session._M_t.
                super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>.
                _M_t.
                super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>
                .super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl =
                     (__uniq_ptr_data<i2p::sam::Session,_std::default_delete<i2p::sam::Session>,_true,_true>
                      )(__uniq_ptr_data<i2p::sam::Session,_std::default_delete<i2p::sam::Session>,_true,_true>
                        )_Var18.
                         super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>
                         .super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl;
                if (bVar11) {
                  i2p::sam::Session::~Session
                            ((Session *)
                             uVar6._M_t.
                             super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>
                             .super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl);
                  operator_delete((void *)uVar6._M_t.
                                          super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>
                                          .super__Head_base<0UL,_i2p::sam::Session_*,_false>.
                                          _M_head_impl,0x118);
                }
                std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>::
                ~unique_ptr((unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>
                             *)&port);
              }
              else {
                _Var18.
                super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>.
                _M_t.
                super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>
                .super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl =
                     (__uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>)
                     (puVar3->_M_t).
                     super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>
                     .super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl;
                (puVar3->_M_t).
                super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>.
                _M_t.
                super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>
                .super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl =
                     (Session *)
                     i2p_transient_session._M_t.
                     super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>
                     .super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl;
                i2p_transient_session._M_t.
                super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>.
                _M_t.
                super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>
                .super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl =
                     (__uniq_ptr_data<i2p::sam::Session,_std::default_delete<i2p::sam::Session>,_true,_true>
                      )(__uniq_ptr_data<i2p::sam::Session,_std::default_delete<i2p::sam::Session>,_true,_true>
                        )_Var18.
                         super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>
                         .super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl;
                std::
                deque<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>,_std::allocator<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>_>_>
                ::pop_front(&this_00->c);
              }
              std::unique_lock<std::mutex>::~unique_lock
                        ((unique_lock<std::mutex> *)&criticalblock28);
              bVar11 = i2p::sam::Session::Connect
                                 ((Session *)
                                  i2p_transient_session._M_t.
                                  super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>
                                  .super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl,
                                  (CService *)address._M_pi,&conn,(bool *)&permission_flags);
              if (!bVar11) {
                criticalblock28.super_unique_lock._8_8_ =
                     criticalblock28.super_unique_lock._8_8_ & 0xffffffffffffff00;
                criticalblock28.super_unique_lock._M_device = &pMVar1->super_mutex;
                std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&criticalblock28);
                uVar6 = i2p_transient_session;
                ppuVar4 = (this_03->m_unused_i2p_sessions).c.
                          super__Deque_base<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>,_std::allocator<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_node;
                if (((long)(this_03->m_unused_i2p_sessions).c.
                           super__Deque_base<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>,_std::allocator<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>_>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_last -
                     (long)(this_03->m_unused_i2p_sessions).c.
                           super__Deque_base<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>,_std::allocator<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>_>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
                    ((long)(this_03->m_unused_i2p_sessions).c.
                           super__Deque_base<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>,_std::allocator<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>_>_>
                           ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                     (long)(this_03->m_unused_i2p_sessions).c.
                           super__Deque_base<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>,_std::allocator<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>_>_>
                           ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
                    ((((ulong)((long)ppuVar4 -
                              (long)(this_03->m_unused_i2p_sessions).c.
                                    super__Deque_base<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>,_std::allocator<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>_>_>
                                    ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
                    (ulong)(ppuVar4 == (_Map_pointer)0x0)) * 0x40 < 10) {
                  i2p_transient_session._M_t.
                  super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>
                  .super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl =
                       (__uniq_ptr_data<i2p::sam::Session,_std::default_delete<i2p::sam::Session>,_true,_true>
                        )(__uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>
                          )0x0;
                  _port = (Session *)
                          uVar6._M_t.
                          super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>
                          .super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl;
                  std::
                  deque<std::unique_ptr<i2p::sam::Session,std::default_delete<i2p::sam::Session>>,std::allocator<std::unique_ptr<i2p::sam::Session,std::default_delete<i2p::sam::Session>>>>
                  ::emplace_back<i2p::sam::Session*>
                            ((deque<std::unique_ptr<i2p::sam::Session,std::default_delete<i2p::sam::Session>>,std::allocator<std::unique_ptr<i2p::sam::Session,std::default_delete<i2p::sam::Session>>>>
                              *)this_00,(Session **)&port);
                }
                std::unique_lock<std::mutex>::~unique_lock
                          ((unique_lock<std::mutex> *)&criticalblock28);
              }
            }
            else {
              bVar11 = i2p::sam::Session::Connect
                                 (this_01,(CService *)address._M_pi,&conn,(bool *)&permission_flags)
              ;
            }
            uVar10._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
            super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
            super__Head_base<0UL,_Sock_*,_false>._M_head_impl =
                 conn.sock._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
                 super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
                 super__Head_base<0UL,_Sock_*,_false>._M_head_impl;
            uVar7._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
            super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
            super__Head_base<0UL,_Sock_*,_false>._M_head_impl =
                 sock._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
                 super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
                 super__Head_base<0UL,_Sock_*,_false>._M_head_impl;
            if (bVar11 != false) {
              conn.sock._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
              super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
              super__Head_base<0UL,_Sock_*,_false>._M_head_impl =
                   (__uniq_ptr_data<Sock,_std::default_delete<Sock>,_true,_true>)
                   (__uniq_ptr_impl<Sock,_std::default_delete<Sock>_>)0x0;
              sock = uVar10;
              if ((__uniq_ptr_impl<Sock,_std::default_delete<Sock>_>)
                  uVar7._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
                  super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
                  super__Head_base<0UL,_Sock_*,_false>._M_head_impl !=
                  (__uniq_ptr_impl<Sock,_std::default_delete<Sock>_>)0x0) {
                (**(code **)(*(long *)uVar7._M_t.
                                      super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
                                      super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
                                      super__Head_base<0UL,_Sock_*,_false>._M_head_impl + 8))();
              }
              prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                        ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)
                         &local_200.indirect_contents,
                         (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&conn.me);
              local_1e8 = CONCAT62(conn.me.super_CNetAddr._26_6_,
                                   CONCAT11(conn.me.super_CNetAddr.m_net._1_1_,
                                            (undefined1)conn.me.super_CNetAddr.m_net));
              local_1e0 = conn.me.port;
              prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                        ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&criticalblock28,
                         (prevector<16U,_unsigned_char,_unsigned_int,_int> *)
                         &local_200.indirect_contents);
              local_1c8._8_8_ = local_1e8;
              local_1c8.__data.__kind._0_2_ = local_1e0;
              local_1c8.__data.__list.__prev = (__pthread_internal_list *)0x5f5e100;
              local_1c8.__data.__list.__next = (__pthread_internal_list *)0x0;
              if (0x10 < addr_bind.super_CService.super_CNetAddr.m_addr._size) {
                free(addr_bind.super_CService.super_CNetAddr.m_addr._union.indirect_contents.
                     indirect);
              }
              addr_bind.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
                   (char *)criticalblock28.super_unique_lock._M_device;
              addr_bind.super_CService.super_CNetAddr.m_addr._union._8_8_ =
                   criticalblock28.super_unique_lock._8_8_;
              addr_bind.super_CService.super_CNetAddr.m_addr._size = local_1c8.__data.__lock;
              local_1c8.__align = local_1c8.__align & 0xffffffff00000000;
              addr_bind.super_CService.super_CNetAddr.m_net = local_1c8.__data.__owner;
              addr_bind.super_CService.super_CNetAddr.m_scope_id = local_1c8.__data.__nusers;
              addr_bind.super_CService.port = local_1c8.__data.__kind._0_2_;
              addr_bind.nTime.__d.__r = (duration)(duration)local_1c8.__data.__list.__prev;
              addr_bind.nServices = (ServiceFlags)local_1c8.__data.__list.__next;
              if (0x10 < local_1f0) {
                free(local_200.indirect_contents.indirect);
                local_200.indirect_contents.indirect = (char *)0x0;
              }
            }
            if (0x10 < conn.peer.super_CNetAddr.m_addr._size) {
              free(conn.peer.super_CNetAddr.m_addr._union.indirect_contents.indirect);
              conn.peer.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
            }
            if (0x10 < conn.me.super_CNetAddr.m_addr._size) {
              free(conn.me.super_CNetAddr.m_addr._union.indirect_contents.indirect);
              conn.me.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
            }
LAB_0019f5e4:
            if ((__uniq_ptr_impl<Sock,_std::default_delete<Sock>_>)
                conn.sock._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
                super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
                super__Head_base<0UL,_Sock_*,_false>._M_head_impl !=
                (__uniq_ptr_impl<Sock,_std::default_delete<Sock>_>)0x0) {
              (**(code **)(*(long *)conn.sock._M_t.
                                    super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
                                    super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
                                    super__Head_base<0UL,_Sock_*,_false>._M_head_impl + 8))();
            }
          }
          else {
            if (!bVar11) {
              ConnectDirectly((CService *)&conn,SUB81(address._M_pi,0));
              uVar10 = conn.sock;
              uVar7 = sock;
              conn.sock._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
              super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
              super__Head_base<0UL,_Sock_*,_false>._M_head_impl =
                   (__uniq_ptr_data<Sock,_std::default_delete<Sock>,_true,_true>)
                   (__uniq_ptr_impl<Sock,_std::default_delete<Sock>_>)0x0;
              sock = uVar10;
              if ((__uniq_ptr_impl<Sock,_std::default_delete<Sock>_>)
                  uVar7._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
                  super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
                  super__Head_base<0UL,_Sock_*,_false>._M_head_impl !=
                  (__uniq_ptr_impl<Sock,_std::default_delete<Sock>_>)0x0) {
                (**(code **)(*(long *)uVar7._M_t.
                                      super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
                                      super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
                                      super__Head_base<0UL,_Sock_*,_false>._M_head_impl + 8))();
              }
              goto LAB_0019f5e4;
            }
            pLVar13 = LogInstance();
            bVar11 = BCLog::Logger::WillLogCategoryLevel(pLVar13,PROXY,Debug);
            if (bVar11) {
              Proxy::ToString_abi_cxx11_((string *)&conn,&proxy);
              CService::ToStringAddrPort_abi_cxx11_
                        ((string *)&criticalblock28,(CService *)address._M_pi);
              logging_function_02._M_str = "ConnectNode";
              logging_function_02._M_len = 0xb;
              source_file_02._M_str =
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
              ;
              source_file_02._M_len = 0x57;
              LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
                        (logging_function_02,source_file_02,0x1ec,PROXY,Debug,
                         (ConstevalFormatString<2U>)0x7e5ad3,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&conn,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &criticalblock28);
              if ((__native_type *)criticalblock28.super_unique_lock._M_device != &local_1c8) {
                operator_delete(criticalblock28.super_unique_lock._M_device,local_1c8.__align + 1);
              }
              if (conn.sock._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
                  super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
                  super__Head_base<0UL,_Sock_*,_false>._M_head_impl !=
                  (__uniq_ptr_data<Sock,_std::default_delete<Sock>,_true,_true>)
                  ((long)&conn.me.super_CNetAddr.m_addr._union + 8)) {
                operator_delete((void *)conn.sock._M_t.
                                        super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t
                                        .super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
                                        super__Head_base<0UL,_Sock_*,_false>._M_head_impl,
                                CONCAT44(conn.me.super_CNetAddr.m_addr._union._12_4_,
                                         conn.me.super_CNetAddr.m_addr._union.indirect_contents.
                                         capacity) + 1);
              }
            }
            CNetAddr::ToStringAddr_abi_cxx11_((string *)&conn,(CNetAddr *)address._M_pi);
            uVar12 = CService::GetPort((CService *)address._M_pi);
            ConnectThroughProxy((Proxy *)&criticalblock28,(string *)&proxy,(uint16_t)&conn,
                                (bool *)(ulong)uVar12);
            pmVar9 = criticalblock28.super_unique_lock._M_device;
            uVar7 = sock;
            criticalblock28.super_unique_lock._M_device = (mutex_type *)0x0;
            sock._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
            super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
            super__Head_base<0UL,_Sock_*,_false>._M_head_impl =
                 (__uniq_ptr_data<Sock,_std::default_delete<Sock>,_true,_true>)
                 (__uniq_ptr_data<Sock,_std::default_delete<Sock>,_true,_true>)pmVar9;
            if ((__uniq_ptr_impl<Sock,_std::default_delete<Sock>_>)
                uVar7._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
                super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
                super__Head_base<0UL,_Sock_*,_false>._M_head_impl !=
                (__uniq_ptr_impl<Sock,_std::default_delete<Sock>_>)0x0) {
              (**(code **)(*(long *)uVar7._M_t.
                                    super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
                                    super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
                                    super__Head_base<0UL,_Sock_*,_false>._M_head_impl + 8))();
            }
            if (criticalblock28.super_unique_lock._M_device != (mutex_type *)0x0) {
              (**(code **)(((criticalblock28.super_unique_lock._M_device)->super___mutex_base).
                           _M_mutex.__align + 8))();
            }
            criticalblock28.super_unique_lock._M_device = (mutex_type *)0x0;
            if (conn.sock._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
                super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
                super__Head_base<0UL,_Sock_*,_false>._M_head_impl !=
                (__uniq_ptr_data<Sock,_std::default_delete<Sock>,_true,_true>)
                ((long)&conn.me.super_CNetAddr.m_addr._union + 8)) {
              operator_delete((void *)conn.sock._M_t.
                                      super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
                                      super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
                                      super__Head_base<0UL,_Sock_*,_false>._M_head_impl,
                              CONCAT44(conn.me.super_CNetAddr.m_addr._union._12_4_,
                                       conn.me.super_CNetAddr.m_addr._union.indirect_contents.
                                       capacity) + 1);
            }
          }
          if ((undefined1)permission_flags == None) {
            this_02 = this_03->addrman;
            tVar15 = NodeClock::now();
            local_2bc = SUB41(conn_type,0);
            AddrMan::Attempt(this_02,(CService *)address._M_pi,local_2bc,
                             (NodeSeconds)((long)tVar15.__d.__r / 1000000000));
          }
        }
        else if ((pszDest_local != (char *)0x0) && (bVar11 = GetNameProxy(&proxy), bVar11)) {
          conn.sock._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
          super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
          super__Head_base<0UL,_Sock_*,_false>._M_head_impl =
               (__uniq_ptr_data<Sock,_std::default_delete<Sock>,_true,_true>)
               ((long)&conn.me.super_CNetAddr.m_addr._union + 8);
          conn.me.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
          conn.me.super_CNetAddr.m_addr._union.indirect_contents.capacity =
               conn.me.super_CNetAddr.m_addr._union.indirect_contents.capacity & 0xffffff00;
          _port = (Session *)CONCAT62(uStack_276,portDefault);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&criticalblock28,pszDest_local,(allocator<char> *)&permission_flags);
          in._M_str = (char *)criticalblock28.super_unique_lock._M_device;
          in._M_len = criticalblock28.super_unique_lock._8_8_;
          SplitHostPort(in,&port,(string *)&conn);
          if ((__native_type *)criticalblock28.super_unique_lock._M_device != &local_1c8) {
            operator_delete(criticalblock28.super_unique_lock._M_device,local_1c8.__align + 1);
          }
          ConnectThroughProxy((Proxy *)&criticalblock28,(string *)&proxy,(uint16_t)&conn,
                              (bool *)((ulong)_port & 0xffff));
          pmVar9 = criticalblock28.super_unique_lock._M_device;
          uVar7 = sock;
          criticalblock28.super_unique_lock._M_device = (mutex_type *)0x0;
          sock._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
          super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
          super__Head_base<0UL,_Sock_*,_false>._M_head_impl =
               (__uniq_ptr_data<Sock,_std::default_delete<Sock>,_true,_true>)
               (__uniq_ptr_data<Sock,_std::default_delete<Sock>,_true,_true>)pmVar9;
          if ((__uniq_ptr_impl<Sock,_std::default_delete<Sock>_>)
              uVar7._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
              super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
              super__Head_base<0UL,_Sock_*,_false>._M_head_impl !=
              (__uniq_ptr_impl<Sock,_std::default_delete<Sock>_>)0x0) {
            (**(code **)(*(long *)uVar7._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>
                                  ._M_t.super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
                                  super__Head_base<0UL,_Sock_*,_false>._M_head_impl + 8))();
          }
          if (criticalblock28.super_unique_lock._M_device != (mutex_type *)0x0) {
            (**(code **)(((criticalblock28.super_unique_lock._M_device)->super___mutex_base).
                         _M_mutex.__align + 8))();
          }
          if (conn.sock._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
              super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
              super__Head_base<0UL,_Sock_*,_false>._M_head_impl !=
              (__uniq_ptr_data<Sock,_std::default_delete<Sock>,_true,_true>)
              ((long)&conn.me.super_CNetAddr.m_addr._union + 8)) {
            operator_delete((void *)conn.sock._M_t.
                                    super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
                                    super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
                                    super__Head_base<0UL,_Sock_*,_false>._M_head_impl,
                            CONCAT44(conn.me.super_CNetAddr.m_addr._union._12_4_,
                                     conn.me.super_CNetAddr.m_addr._union.indirect_contents.capacity
                                    ) + 1);
          }
        }
        uVar7._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
        super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
        super__Head_base<0UL,_Sock_*,_false>._M_head_impl =
             sock._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
             super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
             super__Head_base<0UL,_Sock_*,_false>._M_head_impl;
        if ((__uniq_ptr_impl<Sock,_std::default_delete<Sock>_>)
            sock._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
            super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
            super__Head_base<0UL,_Sock_*,_false>._M_head_impl !=
            (__uniq_ptr_impl<Sock,_std::default_delete<Sock>_>)0x0) {
          permission_flags = None;
          if (iVar20 == 2) {
            std::vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_>::vector
                      ((vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_> *)
                       &port,__x);
          }
          else {
            _port = (Session *)0x0;
            pNStack_270 = (pointer)0x0;
            local_268 = (pointer)0x0;
          }
          AddWhitelistPermissionFlags
                    (this_03,&permission_flags,(CNetAddr *)address._M_pi,
                     (vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_> *)
                     &port);
          LOCK();
          paVar2 = &this_03->nLastNodeId;
          data = (paVar2->super___atomic_base<long>)._M_i;
          (paVar2->super___atomic_base<long>)._M_i = (paVar2->super___atomic_base<long>)._M_i + 1;
          UNLOCK();
          CSipHasher::CSipHasher((CSipHasher *)&conn,this_03->nSeed0,this_03->nSeed1);
          pCVar19 = CSipHasher::Write((CSipHasher *)&conn,0xd93e69e2bbfa5735);
          criticalblock28.super_unique_lock._M_device = (mutex_type *)pCVar19->v[0];
          criticalblock28.super_unique_lock._8_8_ = pCVar19->v[1];
          local_1c8.__align = pCVar19->v[2];
          local_1c8._8_8_ = pCVar19->v[3];
          local_1c8._16_8_ = pCVar19->tmp;
          local_1c8.__data.__list.__prev = (__pthread_internal_list *)*(undefined8 *)&pCVar19->count
          ;
          pCVar19 = CSipHasher::Write((CSipHasher *)&criticalblock28,data);
          nKeyedNetGroupIn = CSipHasher::Finalize(pCVar19);
          bVar11 = CNetAddr::IsValid((CNetAddr *)&addr_bind);
          if (!bVar11) {
            GetBindAddress((CAddress *)&conn,
                           (Sock *)sock._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>
                                   ._M_t.super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
                                   super__Head_base<0UL,_Sock_*,_false>._M_head_impl);
            if (0x10 < addr_bind.super_CService.super_CNetAddr.m_addr._size) {
              free(addr_bind.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect)
              ;
            }
            addr_bind.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
                 (char *)conn.sock._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t
                         .super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
                         super__Head_base<0UL,_Sock_*,_false>._M_head_impl;
            addr_bind.super_CService.super_CNetAddr.m_addr._union._8_8_ =
                 conn.me.super_CNetAddr.m_addr._union.indirect_contents.indirect;
            addr_bind.super_CService.super_CNetAddr.m_addr._size =
                 conn.me.super_CNetAddr.m_addr._union.indirect_contents.capacity;
            conn.me.super_CNetAddr.m_addr._union.indirect_contents.capacity = 0;
            addr_bind.super_CService.super_CNetAddr.m_net = conn.me.super_CNetAddr.m_addr._size;
            addr_bind.super_CService.super_CNetAddr.m_scope_id =
                 conn.me.super_CNetAddr.m_addr._20_4_;
            addr_bind.super_CService.port =
                 CONCAT11(conn.me.super_CNetAddr.m_net._1_1_,
                          (undefined1)conn.me.super_CNetAddr.m_net);
            addr_bind.nTime.__d.__r = (duration)(duration)conn.me._32_8_;
            addr_bind.nServices =
                 (ServiceFlags)conn.peer.super_CNetAddr.m_addr._union.indirect_contents.indirect;
          }
          pCVar17 = (CNode *)operator_new(0x3a8);
          std::__shared_ptr<Sock,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<Sock,std::default_delete<Sock>,void>
                    ((__shared_ptr<Sock,(__gnu_cxx::_Lock_policy)2> *)local_288,&sock);
          addrIn = (CAddress *)CalculateKeyedNetGroup(this_03,(CAddress *)address._M_pi);
          pcVar22 = pszDest_local;
          if (pszDest_local == (char *)0x0) {
            pcVar22 = "";
          }
          criticalblock28.super_unique_lock._M_device = (mutex_type *)&local_1c8;
          sVar14 = strlen(pcVar22);
          node_opts = (CNodeOptions *)0x19f83b;
          this_03 = pCVar23;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&criticalblock28,pcVar22,pcVar22 + sVar14);
          conn.sock._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
          super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
          super__Head_base<0UL,_Sock_*,_false>._M_head_impl._0_4_ = permission_flags;
          conn.me.super_CNetAddr.m_addr._union.indirect_contents.indirect =
               (char *)i2p_transient_session._M_t.
                       super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>
                       .super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl;
          i2p_transient_session._M_t.
          super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>._M_t.
          super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>.
          super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl =
               (__uniq_ptr_data<i2p::sam::Session,_std::default_delete<i2p::sam::Session>,_true,_true>
                )(__uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>)0x0;
          conn.me.super_CNetAddr.m_addr._union.indirect_contents.capacity =
               conn.me.super_CNetAddr.m_addr._union.indirect_contents.capacity & 0xffffff00;
          conn.me.super_CNetAddr.m_addr._16_8_ = ZEXT48(this_03->nReceiveFloodSize);
          sock_00.super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               address._M_pi;
          sock_00.super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)local_288;
          pCVar23 = this_03;
          conn.me.super_CNetAddr.m_net._0_1_ = in_R9B;
          CNode::CNode(pCVar17,data,sock_00,addrIn,nKeyedNetGroupIn,(uint64_t)&addr_bind,
                       (CAddress *)&criticalblock28,
                       (string *)CONCAT71(in_register_00000081,use_v2transport),INBOUND,
                       SUB81(&conn,0),node_opts);
          std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>::~unique_ptr
                    ((unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_> *)
                     &conn.me);
          if ((__native_type *)criticalblock28.super_unique_lock._M_device != &local_1c8) {
            operator_delete(criticalblock28.super_unique_lock._M_device,local_1c8.__align + 1);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_);
          }
          LOCK();
          (pCVar17->nRefCount).super___atomic_base<int>._M_i =
               (pCVar17->nRefCount).super___atomic_base<int>._M_i + 1;
          UNLOCK();
          RandAddEvent((uint32_t)data);
          std::vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_>::~vector
                    ((vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_> *)
                     &port);
        }
        if ((__uniq_ptr_impl<Sock,_std::default_delete<Sock>_>)
            uVar7._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
            super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
            super__Head_base<0UL,_Sock_*,_false>._M_head_impl !=
            (__uniq_ptr_impl<Sock,_std::default_delete<Sock>_>)0x0) goto LAB_0019f954;
        address._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&address._M_pi[3]._M_use_count;
      } while ((pointer)address._M_pi != pCVar8);
    }
    pCVar17 = (CNode *)0x0;
LAB_0019f954:
    std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>::~unique_ptr
              (&i2p_transient_session);
    if (0x10 < addr_bind.super_CService.super_CNetAddr.m_addr._size) {
      free(addr_bind.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect);
      addr_bind.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)proxy.m_unix_socket_path._M_dataplus._M_p != &proxy.m_unix_socket_path.field_2) {
      operator_delete(proxy.m_unix_socket_path._M_dataplus._M_p,
                      CONCAT71(proxy.m_unix_socket_path.field_2._M_allocated_capacity._1_7_,
                               proxy.m_unix_socket_path.field_2._M_local_buf[0]) + 1);
    }
    if (0x10 < proxy.proxy.super_CNetAddr.m_addr._size) {
      free(proxy.proxy.super_CNetAddr.m_addr._union.indirect_contents.indirect);
      proxy.proxy.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
    }
    if ((__uniq_ptr_impl<Sock,_std::default_delete<Sock>_>)
        sock._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
        super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
        super__Head_base<0UL,_Sock_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<Sock,_std::default_delete<Sock>_>)0x0) {
      (**(code **)(*(long *)sock._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
                            super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
                            super__Head_base<0UL,_Sock_*,_false>._M_head_impl + 8))();
    }
LAB_0019fa94:
    std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&local_228);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return pCVar17;
  }
  __stack_chk_fail();
}

Assistant:

CNode* CConnman::ConnectNode(CAddress addrConnect, const char *pszDest, bool fCountFailure, ConnectionType conn_type, bool use_v2transport)
{
    AssertLockNotHeld(m_unused_i2p_sessions_mutex);
    assert(conn_type != ConnectionType::INBOUND);

    if (pszDest == nullptr) {
        if (IsLocal(addrConnect))
            return nullptr;

        // Look for an existing connection
        CNode* pnode = FindNode(static_cast<CService>(addrConnect));
        if (pnode)
        {
            LogPrintf("Failed to open new connection, already connected\n");
            return nullptr;
        }
    }

    LogPrintLevel(BCLog::NET, BCLog::Level::Debug, "trying %s connection %s lastseen=%.1fhrs\n",
        use_v2transport ? "v2" : "v1",
        pszDest ? pszDest : addrConnect.ToStringAddrPort(),
        Ticks<HoursDouble>(pszDest ? 0h : Now<NodeSeconds>() - addrConnect.nTime));

    // Resolve
    const uint16_t default_port{pszDest != nullptr ? GetDefaultPort(pszDest) :
                                                     m_params.GetDefaultPort()};

    // Collection of addresses to try to connect to: either all dns resolved addresses if a domain name (pszDest) is provided, or addrConnect otherwise.
    std::vector<CAddress> connect_to{};
    if (pszDest) {
        std::vector<CService> resolved{Lookup(pszDest, default_port, fNameLookup && !HaveNameProxy(), 256)};
        if (!resolved.empty()) {
            std::shuffle(resolved.begin(), resolved.end(), FastRandomContext());
            // If the connection is made by name, it can be the case that the name resolves to more than one address.
            // We don't want to connect any more of them if we are already connected to one
            for (const auto& r : resolved) {
                addrConnect = CAddress{MaybeFlipIPv6toCJDNS(r), NODE_NONE};
                if (!addrConnect.IsValid()) {
                    LogDebug(BCLog::NET, "Resolver returned invalid address %s for %s\n", addrConnect.ToStringAddrPort(), pszDest);
                    return nullptr;
                }
                // It is possible that we already have a connection to the IP/port pszDest resolved to.
                // In that case, drop the connection that was just created.
                LOCK(m_nodes_mutex);
                CNode* pnode = FindNode(static_cast<CService>(addrConnect));
                if (pnode) {
                    LogPrintf("Not opening a connection to %s, already connected to %s\n", pszDest, addrConnect.ToStringAddrPort());
                    return nullptr;
                }
                // Add the address to the resolved addresses vector so we can try to connect to it later on
                connect_to.push_back(addrConnect);
            }
        } else {
            // For resolution via proxy
            connect_to.push_back(addrConnect);
        }
    } else {
        // Connect via addrConnect directly
        connect_to.push_back(addrConnect);
    }

    // Connect
    std::unique_ptr<Sock> sock;
    Proxy proxy;
    CAddress addr_bind;
    assert(!addr_bind.IsValid());
    std::unique_ptr<i2p::sam::Session> i2p_transient_session;

    for (auto& target_addr: connect_to) {
        if (target_addr.IsValid()) {
            const bool use_proxy{GetProxy(target_addr.GetNetwork(), proxy)};
            bool proxyConnectionFailed = false;

            if (target_addr.IsI2P() && use_proxy) {
                i2p::Connection conn;
                bool connected{false};

                if (m_i2p_sam_session) {
                    connected = m_i2p_sam_session->Connect(target_addr, conn, proxyConnectionFailed);
                } else {
                    {
                        LOCK(m_unused_i2p_sessions_mutex);
                        if (m_unused_i2p_sessions.empty()) {
                            i2p_transient_session =
                                std::make_unique<i2p::sam::Session>(proxy, &interruptNet);
                        } else {
                            i2p_transient_session.swap(m_unused_i2p_sessions.front());
                            m_unused_i2p_sessions.pop();
                        }
                    }
                    connected = i2p_transient_session->Connect(target_addr, conn, proxyConnectionFailed);
                    if (!connected) {
                        LOCK(m_unused_i2p_sessions_mutex);
                        if (m_unused_i2p_sessions.size() < MAX_UNUSED_I2P_SESSIONS_SIZE) {
                            m_unused_i2p_sessions.emplace(i2p_transient_session.release());
                        }
                    }
                }

                if (connected) {
                    sock = std::move(conn.sock);
                    addr_bind = CAddress{conn.me, NODE_NONE};
                }
            } else if (use_proxy) {
                LogPrintLevel(BCLog::PROXY, BCLog::Level::Debug, "Using proxy: %s to connect to %s\n", proxy.ToString(), target_addr.ToStringAddrPort());
                sock = ConnectThroughProxy(proxy, target_addr.ToStringAddr(), target_addr.GetPort(), proxyConnectionFailed);
            } else {
                // no proxy needed (none set for target network)
                sock = ConnectDirectly(target_addr, conn_type == ConnectionType::MANUAL);
            }
            if (!proxyConnectionFailed) {
                // If a connection to the node was attempted, and failure (if any) is not caused by a problem connecting to
                // the proxy, mark this as an attempt.
                addrman.Attempt(target_addr, fCountFailure);
            }
        } else if (pszDest && GetNameProxy(proxy)) {
            std::string host;
            uint16_t port{default_port};
            SplitHostPort(std::string(pszDest), port, host);
            bool proxyConnectionFailed;
            sock = ConnectThroughProxy(proxy, host, port, proxyConnectionFailed);
        }
        // Check any other resolved address (if any) if we fail to connect
        if (!sock) {
            continue;
        }

        NetPermissionFlags permission_flags = NetPermissionFlags::None;
        std::vector<NetWhitelistPermissions> whitelist_permissions = conn_type == ConnectionType::MANUAL ? vWhitelistedRangeOutgoing : std::vector<NetWhitelistPermissions>{};
        AddWhitelistPermissionFlags(permission_flags, target_addr, whitelist_permissions);

        // Add node
        NodeId id = GetNewNodeId();
        uint64_t nonce = GetDeterministicRandomizer(RANDOMIZER_ID_LOCALHOSTNONCE).Write(id).Finalize();
        if (!addr_bind.IsValid()) {
            addr_bind = GetBindAddress(*sock);
        }
        CNode* pnode = new CNode(id,
                                std::move(sock),
                                target_addr,
                                CalculateKeyedNetGroup(target_addr),
                                nonce,
                                addr_bind,
                                pszDest ? pszDest : "",
                                conn_type,
                                /*inbound_onion=*/false,
                                CNodeOptions{
                                    .permission_flags = permission_flags,
                                    .i2p_sam_session = std::move(i2p_transient_session),
                                    .recv_flood_size = nReceiveFloodSize,
                                    .use_v2transport = use_v2transport,
                                });
        pnode->AddRef();

        // We're making a new connection, harvest entropy from the time (and our peer count)
        RandAddEvent((uint32_t)id);

        return pnode;
    }

    return nullptr;
}